

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void getPixelColorRGBA8(uchar *r,uchar *g,uchar *b,uchar *a,uchar *in,size_t i,
                       LodePNGColorMode *mode)

{
  byte bVar1;
  long lVar2;
  uchar uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  switch(mode->colortype) {
  case LCT_GREY:
    uVar4 = mode->bitdepth;
    uVar5 = (ulong)uVar4;
    if (uVar5 == 0x10) {
      uVar3 = in[i * 2];
      *b = uVar3;
      *g = uVar3;
      *r = uVar3;
      if ((mode->key_defined == 0) ||
         ((uint)(ushort)(*(ushort *)(in + i * 2) << 8 | *(ushort *)(in + i * 2) >> 8) != mode->key_r
         )) goto LAB_001b3357;
    }
    else if (uVar4 == 8) {
      bVar1 = in[i];
      *b = bVar1;
      *g = bVar1;
      *r = bVar1;
      if ((mode->key_defined == 0) || (mode->key_r != (uint)bVar1)) goto LAB_001b3357;
    }
    else {
      if (uVar5 == 0) {
        uVar9 = 0;
      }
      else {
        uVar8 = i * uVar5;
        uVar9 = 0;
        uVar7 = uVar5;
        do {
          uVar6 = uVar8 >> 3;
          bVar1 = (byte)uVar8;
          uVar8 = uVar8 + 1;
          uVar9 = uVar9 + ((uint)((in[uVar6] >> (~bVar1 & 7) & 1) != 0) <<
                          ((byte)(uVar7 - 1) & 0x1f));
          uVar6 = uVar7 - 2;
          uVar7 = uVar7 - 1;
        } while (uVar6 < uVar5);
      }
      uVar3 = (uchar)((uVar9 * 0xff) / (uint)~(-1 << ((byte)uVar4 & 0x1f)));
      *b = uVar3;
      *g = uVar3;
      *r = uVar3;
      if ((mode->key_defined == 0) || (uVar9 != mode->key_r)) goto LAB_001b3357;
    }
    goto LAB_001b3388;
  default:
    goto switchD_001b30a7_caseD_1;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      lVar2 = i * 3;
      *r = in[lVar2];
      *g = in[lVar2 + 1];
      bVar1 = in[lVar2 + 2];
      *b = bVar1;
      if (((mode->key_defined == 0) || (mode->key_r != (uint)*r)) ||
         ((mode->key_g != (uint)*g || (mode->key_b != (uint)bVar1)))) {
LAB_001b3357:
        uVar3 = 0xff;
        break;
      }
    }
    else {
      lVar2 = i * 6;
      *r = in[lVar2];
      *g = in[lVar2 + 2];
      *b = in[lVar2 + 4];
      if ((((mode->key_defined == 0) ||
           ((uint)(ushort)(*(ushort *)(in + lVar2) << 8 | *(ushort *)(in + lVar2) >> 8) !=
            mode->key_r)) ||
          ((uint)(ushort)(*(ushort *)(in + lVar2 + 2) << 8 | *(ushort *)(in + lVar2 + 2) >> 8) !=
           mode->key_g)) ||
         ((uint)(ushort)(*(ushort *)(in + lVar2 + 4) << 8 | *(ushort *)(in + lVar2 + 4) >> 8) !=
          mode->key_b)) goto LAB_001b3357;
    }
LAB_001b3388:
    uVar3 = '\0';
    break;
  case LCT_PALETTE:
    uVar5 = (ulong)mode->bitdepth;
    if (uVar5 == 8) {
      uVar4 = (uint)in[i];
    }
    else if (uVar5 == 0) {
      uVar4 = 0;
    }
    else {
      uVar8 = i * uVar5;
      uVar4 = 0;
      uVar7 = uVar5;
      do {
        uVar6 = uVar8 >> 3;
        bVar1 = (byte)uVar8;
        uVar8 = uVar8 + 1;
        uVar4 = uVar4 + ((uint)((in[uVar6] >> (~bVar1 & 7) & 1) != 0) << ((byte)(uVar7 - 1) & 0x1f))
        ;
        uVar6 = uVar7 - 2;
        uVar7 = uVar7 - 1;
      } while (uVar6 < uVar5);
    }
    if (mode->palettesize <= (ulong)uVar4) {
      *b = '\0';
      *g = '\0';
      *r = '\0';
      goto LAB_001b3357;
    }
    uVar5 = (ulong)(uVar4 << 2);
    *r = mode->palette[uVar5];
    *g = mode->palette[uVar5 + 1];
    *b = mode->palette[uVar5 + 2];
    uVar3 = mode->palette[uVar5 + 3];
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      uVar3 = in[i * 2];
      *b = uVar3;
      *g = uVar3;
      *r = uVar3;
      uVar3 = in[i * 2 + 1];
    }
    else {
      uVar3 = in[i * 4];
      *b = uVar3;
      *g = uVar3;
      *r = uVar3;
      uVar3 = in[i * 4 + 2];
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      *r = in[i * 4];
      *g = in[i * 4 + 1];
      *b = in[i * 4 + 2];
      uVar3 = in[i * 4 + 3];
    }
    else {
      *r = in[i * 8];
      *g = in[i * 8 + 2];
      *b = in[i * 8 + 4];
      uVar3 = in[i * 8 + 6];
    }
  }
  *a = uVar3;
switchD_001b30a7_caseD_1:
  return;
}

Assistant:

static void getPixelColorRGBA8(unsigned char* r, unsigned char* g,
                               unsigned char* b, unsigned char* a,
                               const unsigned char* in, size_t i,
                               const LodePNGColorMode* mode)
{
  if(mode->colortype == LCT_GREY)
  {
    if(mode->bitdepth == 8)
    {
      *r = *g = *b = in[i];
      if(mode->key_defined && *r == mode->key_r) *a = 0;
      else *a = 255;
    }
    else if(mode->bitdepth == 16)
    {
      *r = *g = *b = in[i * 2 + 0];
      if(mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r) *a = 0;
      else *a = 255;
    }
    else
    {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = i * mode->bitdepth;
      unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
      *r = *g = *b = (value * 255) / highest;
      if(mode->key_defined && value == mode->key_r) *a = 0;
      else *a = 255;
    }
  }
  else if(mode->colortype == LCT_RGB)
  {
    if(mode->bitdepth == 8)
    {
      *r = in[i * 3 + 0]; *g = in[i * 3 + 1]; *b = in[i * 3 + 2];
      if(mode->key_defined && *r == mode->key_r && *g == mode->key_g && *b == mode->key_b) *a = 0;
      else *a = 255;
    }
    else
    {
      *r = in[i * 6 + 0];
      *g = in[i * 6 + 2];
      *b = in[i * 6 + 4];
      if(mode->key_defined && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
         && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
         && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b) *a = 0;
      else *a = 255;
    }
  }
  else if(mode->colortype == LCT_PALETTE)
  {
    unsigned index;
    if(mode->bitdepth == 8) index = in[i];
    else
    {
      size_t j = i * mode->bitdepth;
      index = readBitsFromReversedStream(&j, in, mode->bitdepth);
    }

    if(index >= mode->palettesize)
    {
      /*This is an error according to the PNG spec, but common PNG decoders make it black instead.
      Done here too, slightly faster due to no error handling needed.*/
      *r = *g = *b = 0;
      *a = 255;
    }
    else
    {
      *r = mode->palette[index * 4 + 0];
      *g = mode->palette[index * 4 + 1];
      *b = mode->palette[index * 4 + 2];
      *a = mode->palette[index * 4 + 3];
    }
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    if(mode->bitdepth == 8)
    {
      *r = *g = *b = in[i * 2 + 0];
      *a = in[i * 2 + 1];
    }
    else
    {
      *r = *g = *b = in[i * 4 + 0];
      *a = in[i * 4 + 2];
    }
  }
  else if(mode->colortype == LCT_RGBA)
  {
    if(mode->bitdepth == 8)
    {
      *r = in[i * 4 + 0];
      *g = in[i * 4 + 1];
      *b = in[i * 4 + 2];
      *a = in[i * 4 + 3];
    }
    else
    {
      *r = in[i * 8 + 0];
      *g = in[i * 8 + 2];
      *b = in[i * 8 + 4];
      *a = in[i * 8 + 6];
    }
  }
}